

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nukedopll.c
# Opt level: O2

void NOPLL_Clock(opll_t *chip,int32_t *buffer)

{
  uint8_t uVar1;
  uint8_t uVar2;
  byte bVar3;
  uint32_t uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  int16_t iVar8;
  byte bVar9;
  uint uVar10;
  int iVar11;
  opll_patch_t *poVar12;
  byte bVar13;
  uint8_t uVar14;
  short sVar15;
  ushort uVar16;
  int16_t iVar17;
  int iVar18;
  uint8_t uVar19;
  uint uVar20;
  ulong uVar21;
  uint uVar22;
  byte bVar23;
  ushort uVar24;
  uint uVar25;
  uint uVar26;
  ushort uVar27;
  uint uVar28;
  byte bVar29;
  uint uVar30;
  byte bVar31;
  byte bVar32;
  bool bVar33;
  bool bVar34;
  bool bVar35;
  bool bVar36;
  byte bVar37;
  byte bVar38;
  bool bVar39;
  
  *buffer = (int)chip->output_m;
  buffer[1] = (int)chip->output_r;
  uVar26 = chip->cycles;
  uVar21 = (ulong)uVar26;
  if (uVar21 == 0) {
    chip->lfo_am_out = (byte)chip->lfo_am_counter >> 3 & 0xf;
  }
  bVar32 = chip->rm_enable;
  bVar31 = (char)bVar32 >> 1;
  chip->rm_enable = bVar31;
  bVar37 = chip->write_mode_address;
  if (((bVar37 & 0x10) != 0) && (chip->write_d_en != '\0')) {
    uVar20 = bVar37 & 0xf;
    if (uVar20 < 0x10) {
      uVar10 = bVar37 & 1;
      switch(uVar20) {
      case 0:
      case 1:
        bVar32 = chip->write_data;
        (chip->patch).multi[uVar10] = bVar32 & 0xf;
        (chip->patch).ksr[uVar10] = bVar32 >> 4 & 1;
        (chip->patch).et[uVar10] = bVar32 >> 5 & 1;
        (chip->patch).vib[uVar10] = bVar32 >> 6 & 1;
        (chip->patch).am[uVar10] = bVar32 >> 7;
        break;
      case 2:
        bVar32 = chip->write_data;
        (chip->patch).ksl[0] = bVar32 >> 6;
        (chip->patch).tl = bVar32 & 0x3f;
        break;
      case 3:
        bVar32 = chip->write_data;
        (chip->patch).ksl[1] = bVar32 >> 6;
        (chip->patch).dc = bVar32 >> 4 & 1;
        (chip->patch).dm = bVar32 >> 3 & 1;
        (chip->patch).fb = bVar32 & 7;
        break;
      case 4:
      case 5:
        bVar32 = chip->write_data;
        (chip->patch).dr[uVar10] = bVar32 & 0xf;
        (chip->patch).ar[uVar10] = bVar32 >> 4;
        break;
      case 6:
      case 7:
        bVar32 = chip->write_data;
        (chip->patch).rr[uVar10] = bVar32 & 0xf;
        (chip->patch).sl[uVar10] = bVar32 >> 4;
        break;
      case 0xe:
        bVar37 = chip->write_data & 0x3f;
        chip->rhythm = bVar37;
        if (chip->chip_type == 1) {
          bVar37 = bVar37 | 0x20;
          chip->rhythm = bVar37;
        }
        bVar31 = (bVar37 & 0x20) << 2 | bVar32 >> 1;
        chip->rm_enable = bVar31;
        break;
      case 0xf:
        chip->testmode = chip->write_data & 0xf;
      }
    }
  }
  uVar10 = chip->rm_select + 1;
  uVar20 = 6;
  if (uVar10 < 6) {
    uVar20 = uVar10;
  }
  uVar10 = 0;
  if (-1 < (char)bVar31) {
    uVar10 = uVar20;
  }
  if (uVar21 != 0xb) {
    uVar10 = uVar20;
  }
  chip->rm_select = uVar10;
  uVar5 = (ulong)(uVar26 + 1) / 3;
  uVar22 = (uint)uVar5 & 1;
  uVar20 = ch_offset[uVar21];
  bVar32 = chip->inst[uVar20];
  if ((bVar32 == 0) && (5 < uVar10)) {
    poVar12 = &chip->patch;
LAB_00122876:
    if ((uVar5 & 1) != 0) {
      bVar32 = chip->vol[uVar20];
      goto LAB_00122883;
    }
    bVar32 = poVar12->tl;
  }
  else {
    uVar28 = bVar32 - 1;
    if (uVar10 < 6) {
      uVar28 = uVar10 + 0xf;
    }
    poVar12 = chip->patchrom + uVar28;
    if (1 < uVar10 - 1) goto LAB_00122876;
LAB_00122883:
    bVar32 = bVar32 << 2;
  }
  chip->c_tl = bVar32;
  chip->c_adrr[0] = poVar12->ar[uVar22];
  chip->c_adrr[1] = poVar12->dr[uVar22];
  chip->c_adrr[2] = poVar12->rr[uVar22];
  uVar1 = poVar12->et[uVar22];
  chip->c_et = uVar1;
  uVar2 = poVar12->ksr[uVar22];
  chip->c_ksr = uVar2;
  uVar19 = poVar12->ksl[uVar22];
  chip->c_ksl = uVar19;
  uVar27 = chip->fnum[uVar20];
  bVar13 = (byte)(uVar27 >> 8) | chip->block[uVar20] * '\x02';
  chip->c_ksr_freq = bVar13;
  bVar38 = (byte)(uVar27 >> 5);
  chip->c_ksl_freq = bVar38;
  bVar37 = chip->block[uVar20];
  chip->c_ksl_block = bVar37;
  uVar27 = chip->ch_out;
  bVar33 = false;
  if (((uVar21 / 3 & 1) == 0) && (bVar33 = true, (bVar31 & 0x40) != 0)) {
    bVar33 = (uVar26 + 0xf) % 0x12 < 0xc;
  }
  uVar4 = chip->chip_type;
  if (uVar4 == 1) {
    sVar15 = uVar27 - ((short)~uVar27 >> 0xf);
    if (!bVar33) {
      sVar15 = 0;
    }
    chip->output_m = sVar15;
    uVar16 = 0;
  }
  else {
    if (uVar26 < 0x12 && (bVar31 & 0x40) != 0) {
      uVar28 = 0x3063f >> ((byte)uVar26 & 0x1f);
    }
    else {
      uVar28 = 0;
    }
    if ((uVar4 == 4) || (uVar4 == 2)) {
      uVar16 = 0;
      if (bVar33) {
        uVar16 = uVar27;
      }
      chip->output_m = uVar16;
      uVar16 = 0;
      if ((uVar28 & 1) != 0) {
        uVar16 = uVar27;
      }
    }
    else {
      uVar24 = uVar27 + -((short)~uVar27 >> 0xf);
      uVar16 = -((short)~uVar27 >> 0xf) + (short)(char)(uVar27 >> 8);
      uVar27 = uVar16;
      if (bVar33) {
        uVar27 = uVar24;
      }
      chip->output_m = uVar27;
      if ((uVar28 & 1) != 0) {
        uVar16 = uVar24;
      }
    }
  }
  bVar29 = bVar31 & 0x40;
  chip->output_r = uVar16;
  uVar28 = 0;
  uVar6 = (ulong)(uVar26 + 0x11) % 0x12;
  chip->pg_phase[uVar6] = chip->pg_inc + chip->pg_phase_next;
  bVar34 = uVar26 - 0xd < 2;
  bVar33 = true;
  if (!bVar34 || bVar29 == 0) {
    bVar33 = ((ulong)(uVar26 + 3) / 3 & 1) == 0;
  }
  uVar25 = chip->pg_phase[uVar21];
  bVar3 = chip->testmode;
  if ((bVar3 & 4) == 0) {
    if (bVar33) {
      if ((chip->eg_dokon & 1) == 0) {
LAB_00122a78:
        uVar28 = uVar25;
      }
    }
    else {
      uVar28 = 0;
      if (-1 < (short)chip->eg_dokon) goto LAB_00122a78;
    }
  }
  chip->pg_phase_next = uVar28;
  if (uVar21 == 0x11) {
    if ((char)bVar31 < '\0') {
      bVar9 = (byte)(uVar25 >> 0xc) & 1;
      chip->rm_tc_bit3 = bVar9;
      bVar23 = (byte)(uVar25 >> 0xe) & 1;
      chip->rm_tc_bit5 = bVar23;
      uVar25 = (uint)(byte)(bVar9 ^ bVar23 | chip->rm_hh_bit7 ^ chip->rm_hh_bit2 |
                           bVar23 ^ chip->rm_hh_bit3) << 9 | 0x100;
      goto LAB_00122b37;
    }
LAB_00122b33:
    uVar25 = uVar25 >> 9;
  }
  else {
    if (uVar26 == 0xd) {
      chip->rm_hh_bit2 = (byte)(uVar25 >> 0xb) & 1;
      chip->rm_hh_bit3 = (byte)(uVar25 >> 0xc) & 1;
      chip->rm_hh_bit7 = (byte)(uVar25 >> 0x10) & 1;
      chip->rm_hh_bit8 = (byte)(uVar25 >> 0x11) & 1;
    }
    if (-1 < (char)bVar31) goto LAB_00122b33;
    if (uVar21 == 0x10) {
      uVar25 = (chip->rm_noise & 1 ^ (uint)chip->rm_hh_bit8) << 8 | (uint)chip->rm_hh_bit8 << 9;
    }
    else {
      if (uVar26 != 0xd) goto LAB_00122b33;
      uVar28 = (uint)(byte)(chip->rm_tc_bit5 ^ chip->rm_tc_bit3 |
                           chip->rm_hh_bit3 ^ chip->rm_tc_bit5 | chip->rm_hh_bit7 ^ chip->rm_hh_bit2
                           );
      uVar25 = uVar28 << 9;
      if ((chip->rm_noise & 1) == uVar28) {
        uVar25 = uVar25 | 0x34;
      }
      else {
        uVar25 = uVar25 | 0xd0;
      }
    }
  }
LAB_00122b37:
  chip->pg_out = (uint16_t)uVar25;
  bVar39 = -1 < (char)bVar31;
  bVar35 = 1 < uVar26 - 0xf;
  bVar36 = (uVar5 & 1) != 0;
  bVar33 = true;
  if ((((bVar34 && bVar29 != 0) || (bVar33 = ((ulong)(uVar26 + 3) / 3 & 1) == 0, bVar29 != 0)) &&
      ((uVar26 & 0xfffffffe) == 0x10)) || ((uVar21 / 3 & 1) == 0)) {
    uVar28 = 0;
  }
  else {
    uVar28 = chip->op_mod * 2;
  }
  if ((!bVar33) && (chip->c_fb != '\0')) {
    uVar28 = uVar28 | (int)chip->op_fbsum >> (7 - chip->c_fb & 0x1f);
  }
  bVar29 = chip->op_neg;
  bVar9 = (byte)chip->op_exp_s;
  if (chip->eg_silent != '\0') goto LAB_00122bc6;
  if ((bVar29 & 2) == 0) {
LAB_00122be4:
    uVar27 = chip->op_exp_m >> (bVar9 & 0x1f);
LAB_00122bef:
    uVar27 = uVar27 ^ (short)((char)(bVar29 << 6) >> 7);
  }
  else {
    if (bVar36 && (bVar35 || bVar39)) {
      if ((chip->c_dm & 4) != 0) goto LAB_00122bc6;
      goto LAB_00122be4;
    }
    if ((chip->c_dc & 4) == 0) goto LAB_00122be4;
LAB_00122bc6:
    uVar27 = chip->op_exp_m >> (bVar9 & 0x1f | 0xc);
    if (chip->eg_silent == '\0') goto LAB_00122bef;
  }
  uVar30 = (uint)chip->eg_out * 0x10 + (uint)chip->op_logsin;
  if (0xffe < uVar30) {
    uVar30 = 0xfff;
  }
  chip->op_exp_m = exprom[uVar30 & 0xff];
  chip->op_exp_s = (uint16_t)(uVar30 >> 8);
  uVar28 = uVar28 + (uVar25 & 0xffff);
  uVar30 = uVar28 & 0x3ff;
  uVar25 = uVar30 ^ 0xff;
  if ((uVar28 >> 8 & 1) == 0) {
    uVar25 = uVar30;
  }
  chip->op_logsin = logsinrom[uVar25 & 0xff];
  chip->op_neg = (byte)(uVar25 >> 9) | bVar29 * '\x02';
  uVar7 = (ulong)(uVar26 + 3) % 9;
  chip->op_fbsum = (int16_t)((uint)((int)chip->op_fb2[uVar7] + (int)chip->op_fb1[uVar7]) >> 1);
  if (bVar36 && (bVar35 || bVar39)) {
    uVar7 = (ulong)uVar26 % 9;
    chip->op_fb2[uVar7] = chip->op_fb1[uVar7];
    chip->op_fb1[uVar7] = uVar27;
  }
  chip->op_mod = uVar27 & 0x1ff;
  uVar28 = (uint)(short)uVar27;
  iVar17 = 0;
  if (uVar4 == 1) goto switchD_00122d1a_caseD_5;
  iVar17 = 0;
  switch(uVar21) {
  case 0:
    chip->ch_out_sd = (int16_t)(uVar28 >> 3);
    goto LAB_00122e2a;
  case 1:
    chip->ch_out_tc = (int16_t)(uVar28 >> 3);
    goto LAB_00122e2a;
  case 2:
    iVar17 = chip->ch_out_hh;
    break;
  case 3:
    iVar17 = chip->ch_out_tm;
    break;
  case 4:
    iVar17 = chip->ch_out_bd;
    break;
  case 8:
    iVar17 = chip->ch_out_sd;
    break;
  case 9:
    iVar17 = chip->ch_out_tc;
    break;
  case 0xf:
    chip->ch_out_hh = (int16_t)(uVar28 >> 3);
    goto LAB_00122e2a;
  case 0x10:
    chip->ch_out_tm = (int16_t)(uVar28 >> 3);
    goto LAB_00122e2a;
  case 0x11:
    chip->ch_out_bd = (int16_t)(uVar28 >> 3);
LAB_00122e2a:
    iVar17 = 0;
  }
switchD_00122d1a_caseD_5:
  iVar8 = 0;
  if ((char)bVar31 < '\0') {
    iVar8 = iVar17;
  }
  iVar17 = (int16_t)((int)uVar28 >> 3);
  if (bVar36 && (bVar35 || bVar39)) {
    iVar17 = iVar8;
  }
  chip->ch_out = iVar17;
  uVar27 = chip->c_fnum;
  iVar11 = (uint)uVar27 + (uint)uVar27;
  if (chip->c_vib == '\0') goto switchD_00122e80_caseD_4;
  switch(chip->lfo_vib_counter) {
  case '\x01':
  case '\x03':
    uVar27 = uVar27 >> 7;
    break;
  case '\x02':
    uVar27 = uVar27 >> 6;
    break;
  default:
    goto switchD_00122e80_caseD_4;
  case '\x05':
  case '\a':
    uVar27 = uVar27 >> 7;
    goto LAB_00122e97;
  case '\x06':
    uVar27 = uVar27 >> 6;
LAB_00122e97:
    iVar11 = iVar11 - (uint)uVar27;
    goto switchD_00122e80_caseD_4;
  }
  iVar11 = iVar11 + (uint)uVar27;
switchD_00122e80_caseD_4:
  chip->pg_inc = ((uint)(iVar11 << ((byte)chip->c_block & 0x1f)) >> 1) * pg_multi[chip->c_multi] >>
                 1;
  uVar28 = (uint)chip->eg_ksltl + (uint)chip->eg_level[uVar6];
  if (chip->c_am != '\0') {
    uVar28 = uVar28 + chip->lfo_am_out;
  }
  uVar14 = (uint8_t)uVar28;
  if (0x7e < uVar28) {
    uVar14 = '\x7f';
  }
  sVar15 = 0;
  if ((bVar3 & 1) != 0) {
    uVar14 = '\0';
  }
  chip->eg_out = uVar14;
  if (uVar19 != '\0') {
    iVar18 = eg_ksltable[bVar38] + (uint)bVar37 * 8 + -0x40;
    iVar11 = 0;
    if (0 < iVar18) {
      iVar11 = iVar18;
    }
    sVar15 = (short)(iVar11 * 2 >> (3 - uVar19 & 0x1f));
  }
  chip->eg_ksltl = sVar15 + (ushort)bVar32 * 2;
  bVar32 = chip->eg_counter_state;
  bVar31 = bVar32 & 3;
  bVar37 = bVar31 == 3;
  if ((bool)bVar37 && uVar21 != 0) {
    bVar37 = chip->eg_timer_carry;
  }
  uVar28 = chip->eg_timer;
  uVar25 = (uVar28 & 1) + (uint)bVar37;
  chip->eg_timer_carry = (byte)uVar25 >> 1;
  uVar30 = (uVar25 & 1) << 0x11;
  uVar25 = uVar28 >> 1 | uVar30;
  chip->eg_timer = uVar25;
  if ((bVar3 & 8) != 0) {
    uVar25._0_1_ = chip->write_data;
    uVar25._1_1_ = chip->write_a;
    uVar25._2_1_ = chip->write_d;
    uVar25._3_1_ = chip->write_a_en;
    uVar25 = uVar28 >> 1 & 0x2ffff | uVar30 | (uVar25 & 4) << 0xe;
    chip->eg_timer = uVar25;
  }
  if ((chip->eg_timer_shift_stop == 0) && ((uVar25 & 0x10000) != 0)) {
    chip->eg_timer_shift = (byte)uVar26;
  }
  if ((uVar21 == 0) && ((chip->eg_counter_state_prev & 1) != 0)) {
    chip->eg_timer_low_lock = (byte)uVar28 & 3;
    bVar37 = 0;
    if (chip->eg_timer_shift < 0xe) {
      bVar37 = chip->eg_timer_shift;
    }
    chip->eg_timer_shift_lock = bVar37;
    chip->eg_timer_shift = '\0';
  }
  bVar37 = (byte)(uVar25 >> 0x10) & 1 | chip->eg_timer_shift_stop;
  if (uVar21 == 0) {
    bVar37 = 0;
  }
  chip->eg_timer_shift_stop = bVar37;
  chip->eg_counter_state_prev = bVar32;
  if (uVar21 == 0x11) {
    chip->eg_counter_state = bVar32 + 1;
  }
  uVar6 = (ulong)(uVar26 + 0x10) % 0x12;
  bVar37 = chip->eg_level[uVar6];
  chip->eg_silent = bVar37 == 0x7f;
  bVar38 = chip->eg_state[uVar6];
  bVar29 = bVar37;
  if (((bVar38 != 0) && ((chip->eg_off & 2) != 0)) && (bVar29 = 0x7f, (chip->eg_dokon & 2) != 0)) {
    bVar29 = bVar37;
  }
  if ((chip->eg_maxrate != '\0') && ((chip->eg_dokon & 2) != 0)) {
    bVar29 = 0;
  }
  bVar9 = 0;
  if (bVar38 - 2 < 2) {
    if (((chip->eg_off & 2) != 0) || ((chip->eg_dokon & 2) != 0)) goto LAB_001232a5;
    bVar37 = 2;
    switch(chip->eg_rate_hi) {
    case '\f':
      if (chip->eg_inc_hi == '\0') {
        bVar32 = bVar31 == 3;
      }
      bVar37 = 0;
      bVar9 = 0;
      if ((bVar32 & 1) == 0) goto switchD_001230e2_caseD_f;
      bVar33 = true;
      goto LAB_00123206;
    case '\r':
      bVar9 = 0;
      bVar37 = 0;
      if ((bVar32 & 1) != 0 || chip->eg_inc_hi != '\0') {
        bVar33 = true;
        goto LAB_00123206;
      }
      break;
    case '\x0e':
      if (chip->eg_inc_hi == '\0') {
        bVar33 = true;
        bVar9 = 0;
        goto LAB_00123206;
      }
      break;
    case '\x0f':
switchD_001230e2_caseD_f:
      break;
    default:
      bVar37 = 0;
    }
    bVar9 = bVar37;
    bVar33 = chip->eg_inc_lo != '\0' && bVar31 == 3;
LAB_00123206:
    bVar9 = bVar9 | bVar33;
    goto LAB_001232a5;
  }
  if (bVar38 != 1) {
    bVar33 = bVar38 == 0;
    bVar38 = 0;
    bVar9 = 0;
    if (bVar33) {
      bVar9 = 0;
      if (((chip->eg_maxrate == '\0') && ((chip->eg_kon & 2) != 0)) && (bVar37 != 0)) {
        if (chip->eg_rate_hi < 0xc) {
          uVar28 = (uint)chip->eg_inc_lo;
        }
        else {
          uVar28 = ((uint)chip->eg_inc_hi + (uint)chip->eg_rate_hi) - 0xb;
        }
        bVar9 = ~(bVar37 >> (5U - (char)uVar28 & 0x1f));
        if (uVar28 == 0) {
          bVar9 = 0;
        }
      }
      bVar38 = bVar37 == 0;
    }
    goto LAB_001232a5;
  }
  if ((chip->eg_off & 2) != 0) {
    uVar27 = (ushort)(bVar37 >> 3);
LAB_0012318d:
    bVar9 = 0;
    goto LAB_0012329b;
  }
  uVar27 = (ushort)(bVar37 >> 3);
  if (((chip->eg_dokon & 2) != 0) || (uVar27 == chip->eg_sl)) goto LAB_0012318d;
  bVar9 = 2;
  switch(chip->eg_rate_hi) {
  case '\f':
    if (chip->eg_inc_hi == '\0') {
      bVar32 = bVar31 == 3;
    }
    bVar34 = (bVar32 & 1) == 0;
    goto LAB_00123266;
  case '\r':
    bVar34 = (bVar32 & 1) == 0 && chip->eg_inc_hi == '\0';
LAB_00123266:
    bVar9 = 0;
    bVar33 = true;
    if (bVar34) break;
    goto LAB_00123298;
  case '\x0e':
    bVar33 = true;
    if (chip->eg_inc_hi != '\0') break;
    bVar9 = 0;
    goto LAB_00123298;
  case '\x0f':
    break;
  default:
    bVar9 = 0;
  }
  bVar33 = chip->eg_inc_lo != '\0' && bVar31 == 3;
LAB_00123298:
  bVar9 = bVar9 | bVar33;
LAB_0012329b:
  bVar38 = (uVar27 == chip->eg_sl) + 1;
LAB_001232a5:
  bVar32 = chip->eg_kon;
  if ((bVar32 & 2) == 0) {
    bVar38 = 3;
  }
  uVar28 = chip->eg_dokon;
  bVar37 = 0;
  if ((uVar28 & 2) == 0) {
    bVar37 = bVar38;
  }
  chip->eg_level[uVar6] = bVar9 + bVar29;
  chip->eg_state[uVar6] = bVar37;
  bVar37 = chip->eg_rate;
  bVar31 = bVar37 >> 2;
  chip->eg_inc_hi =
       *(uint8_t *)
        ((long)eg_stephi[0] + (ulong)chip->eg_timer_low_lock * 4 + (ulong)((bVar37 & 3) << 4));
  chip->eg_inc_lo = '\0';
  if ((bVar37 < 0x30) && (chip->eg_zerorate == '\0')) {
    bVar38 = chip->eg_timer_shift_lock + bVar31 & 0xf;
    if (bVar38 == 0xc) {
      bVar37 = 1;
    }
    else {
      if (bVar38 != 0xe) {
        if (bVar38 != 0xd) goto LAB_00123348;
        bVar37 = bVar37 >> 1;
      }
      bVar37 = bVar37 & 1;
    }
    chip->eg_inc_lo = bVar37;
  }
LAB_00123348:
  chip->eg_maxrate = bVar31 == 0xf;
  chip->eg_rate_hi = bVar31;
  bVar31 = bVar32 * '\x02' | chip->kon[uVar20];
  chip->eg_kon = bVar31;
  bVar32 = chip->eg_off * '\x02';
  chip->eg_off = bVar32;
  bVar37 = chip->eg_level[uVar21] & 0xfc;
  chip->eg_off = bVar37 == 0x7c | bVar32;
  switch(uVar10) {
  case 0:
  case 3:
    bVar32 = chip->rhythm >> 4;
    break;
  case 1:
    bVar32 = chip->rhythm;
    break;
  case 2:
    bVar32 = chip->rhythm >> 2;
    break;
  case 4:
    bVar32 = chip->rhythm >> 3;
    break;
  case 5:
    bVar32 = chip->rhythm >> 1;
    break;
  default:
    goto switchD_0012338e_default;
  }
  bVar31 = bVar31 | bVar32 & 1;
  chip->eg_kon = bVar31;
switchD_0012338e_default:
  uVar28 = uVar28 * 2;
  chip->eg_dokon = uVar28;
  switch(chip->eg_state[uVar21]) {
  case '\0':
switchD_001233e9_caseD_0:
    uVar19 = chip->c_adrr[0];
    break;
  case '\x01':
    uVar19 = chip->c_adrr[1];
    break;
  case '\x02':
    if (uVar1 != '\0') goto switchD_001233e9_default;
LAB_00123424:
    uVar19 = chip->c_adrr[2];
    break;
  case '\x03':
    if (((bVar31 & 1) != 0) && (bVar37 == 0x7c)) {
      chip->eg_dokon = uVar28 | 1;
      goto switchD_001233e9_caseD_0;
    }
    uVar19 = '\x05';
    if (chip->son[uVar20] == '\0') goto LAB_00123424;
    break;
  default:
switchD_001233e9_default:
    uVar19 = '\0';
  }
  uVar14 = uVar19;
  if (((uVar5 & 1) == 0) && ((bVar31 & 1) == 0)) {
    uVar14 = '\0';
    if (uVar10 - 1 < 2) {
      uVar14 = uVar19;
    }
  }
  else if ((bVar31 & 1) == 0) {
    if ((((uVar5 & 1) != 0) && (chip->son[uVar20] == '\0')) && (uVar1 == '\0')) {
      uVar14 = '\a';
    }
  }
  else {
    uVar14 = '\f';
    if (bVar37 == 0x7c) {
      uVar14 = uVar19;
    }
    if (chip->eg_state[uVar21] != '\x03') {
      uVar14 = uVar19;
    }
  }
  chip->eg_zerorate = uVar14 == '\0';
  bVar32 = bVar13 >> 2;
  if (uVar2 != '\0') {
    bVar32 = bVar13;
  }
  bVar37 = uVar14 * '\x04' + bVar32;
  bVar32 = bVar32 & 3 | 0x3c;
  if ((bVar37 & 0x40) == 0) {
    bVar32 = bVar37;
  }
  chip->eg_rate = bVar32;
  chip->eg_sl = (ushort)chip->c_sl;
  if (uVar26 == 0x11) {
    uVar27 = chip->lfo_counter;
    chip->lfo_am_step = (uint8_t)((uVar27 & 0x3f) + 1 >> 6);
    chip->lfo_vib_counter =
         ((byte)((uVar27 & 0x3ff) + 1 >> 10) | bVar3 >> 3 & 1) + chip->lfo_vib_counter & 7;
    chip->lfo_counter = uVar27 + 1;
LAB_00123539:
    chip->lfo_am_car = '\0';
    bVar32 = 0;
  }
  else {
    if ((bVar3 & 8) == 0 && chip->lfo_am_step == '\0') {
      if (uVar26 < 9) {
        bVar32 = 0;
        goto LAB_00123764;
      }
      goto LAB_00123539;
    }
    if (8 < uVar26) goto LAB_00123539;
    bVar32 = uVar21 == 0 | chip->lfo_am_dir;
LAB_00123764:
    if (uVar21 == 0) {
      if (chip->lfo_am_dir == '\0') {
        if ((~chip->lfo_am_counter & 0x69) == 0) {
          chip->lfo_am_dir = '\x01';
        }
      }
      else if ((chip->lfo_am_counter & 0x7f) == 0) {
        chip->lfo_am_dir = '\0';
      }
    }
  }
  bVar32 = bVar32 + chip->lfo_am_car + ((byte)chip->lfo_am_counter & 1);
  chip->lfo_am_car = bVar32 >> 1;
  uVar27 = chip->lfo_am_counter >> 1;
  chip->lfo_am_counter = (ushort)(bVar32 & 1) << 8 | uVar27;
  if ((bVar3 & 2) != 0) {
    chip->lfo_vib_counter = '\0';
    chip->lfo_counter = 0;
    chip->lfo_am_dir = '\0';
    chip->lfo_am_counter = uVar27 & 0xff;
  }
  uVar28 = chip->rm_noise;
  chip->rm_noise =
       uVar28 >> 1 |
       (uint)(((byte)(uVar28 >> 0xe) ^ (byte)uVar28 | bVar3 >> 1) & 1 | uVar28 == 0) << 0x16;
  if ((uVar10 < 6) || (chip->inst[uVar20] != 0)) {
    uVar28 = chip->inst[uVar20] - 1;
    if (uVar10 < 6) {
      uVar28 = uVar10 + 0xf;
    }
    poVar12 = chip->patchrom + uVar28;
  }
  else {
    poVar12 = &chip->patch;
  }
  chip->c_fnum = chip->fnum[uVar20];
  chip->c_block = (ushort)chip->block[uVar20];
  chip->c_multi = poVar12->multi[uVar22];
  chip->c_sl = poVar12->sl[uVar22];
  chip->c_fb = poVar12->fb;
  chip->c_vib = poVar12->vib[uVar22];
  chip->c_am = poVar12->am[uVar22];
  chip->c_dc = chip->c_dc * '\x02' | poVar12->dc;
  chip->c_dm = chip->c_dm * '\x02' | poVar12->dm;
  uVar1 = chip->write_a_en;
  if (uVar1 == '\0') {
    if (chip->write_fm_address != '\0') goto LAB_0012368e;
    if (chip->write_fm_data == '\0') goto LAB_00123892;
    bVar33 = true;
LAB_001236d6:
    uVar20 = chip->address & 0xf;
    if (uVar26 == uVar20) {
      uVar10 = uVar26 - 9;
      if ((byte)uVar20 < 9) {
        uVar10 = uVar26;
      }
      uVar26 = chip->address & 0xfffffff0;
      if (uVar26 == 0x30) {
        bVar32 = chip->data;
        chip->vol[uVar10] = bVar32 & 0xf;
        chip->inst[uVar10] = bVar32 >> 4;
      }
      else if (uVar26 == 0x20) {
        bVar32 = chip->data;
        if (uVar4 == 5) {
          chip->fnum[uVar10] = bVar32 & 0xf | chip->fnum[uVar10] & 0x1f0;
        }
        else {
          chip->fnum[uVar10] = (bVar32 & 1) << 8 | chip->fnum[uVar10] & 0xff;
          chip->block[uVar10] = bVar32 >> 1 & 7;
        }
        chip->kon[uVar10] = bVar32 >> 4 & 1;
        chip->son[uVar10] = bVar32 >> 5 & 1;
      }
      else if (uVar26 == 0x10) {
        bVar32 = chip->data;
        if (uVar4 == 5) {
          chip->fnum[uVar10] = (bVar32 & 0x1f) << 4 | chip->fnum[uVar10] & 0xf;
          chip->block[uVar10] = bVar32 >> 5;
        }
        else {
          chip->fnum[uVar10] = (ushort)bVar32 | chip->fnum[uVar10] & 0x100;
        }
      }
    }
    if (bVar33) goto LAB_00123892;
LAB_00123870:
    if (chip->write_d_en != '\0') {
      chip->write_fm_data = '\x01';
    }
    if (uVar1 == '\0') goto LAB_00123892;
    bVar32 = chip->write_data;
  }
  else {
    bVar32 = chip->write_data;
    if (bVar32 < 0x40) {
      chip->write_fm_address = '\x01';
      chip->address = bVar32;
LAB_0012368e:
      if (chip->write_d_en != '\0') {
        chip->data = chip->write_data;
      }
      if (chip->write_fm_data == '\0') {
        if (uVar1 == '\0') goto LAB_00123870;
      }
      else if (uVar1 == '\0') {
        bVar33 = false;
        goto LAB_001236d6;
      }
      chip->write_fm_data = '\0';
      goto LAB_00123870;
    }
    chip->write_fm_address = '\0';
    chip->write_fm_data = '\0';
  }
  bVar37 = bVar32 | 0x10;
  if (0xf < bVar32) {
    bVar37 = 0;
  }
  chip->write_mode_address = bVar37;
LAB_00123892:
  chip->write_a_en = (chip->write_a & 3) == 1;
  chip->write_d_en = (chip->write_d & 3) == 1;
  chip->write_a = chip->write_a * '\x02';
  chip->write_d = chip->write_d * '\x02';
  chip->cycles = (chip->cycles + 1) % 0x12;
  return;
}

Assistant:

void NOPLL_Clock(opll_t *chip, int32_t *buffer) {
    buffer[0] = chip->output_m;
    buffer[1] = chip->output_r;
    if (chip->cycles == 0) {
        chip->lfo_am_out = (chip->lfo_am_counter >> 3) & 0x0f;
    }
    chip->rm_enable >>= 1;
    OPLL_DoModeWrite(chip);
    chip->rm_select++;
    if (chip->rm_select > rm_num_tc) {
        chip->rm_select = rm_num_tc + 1;
    }
    if (chip->cycles == 11 && (chip->rm_enable & 0x80) == 0x80) {
        chip->rm_select = rm_num_bd0;
    }
    OPLL_PreparePatch1(chip);

    OPLL_Channel(chip);

    OPLL_PhaseGenerate(chip);

    OPLL_Operator(chip);

    OPLL_PhaseCalcIncrement(chip);

    OPLL_EnvelopeOutput(chip);
    OPLL_EnvelopeKSLTL(chip);
    OPLL_EnvelopeGenerate(chip);

    OPLL_DoLFO(chip);
    OPLL_DoRhythm(chip);
    OPLL_PreparePatch2(chip);
    OPLL_DoRegWrite(chip);
    OPLL_DoIO(chip);
    chip->cycles = (chip->cycles + 1) % 18;

}